

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintString
          (string *__return_storage_ptr__,FieldValuePrinter *this,string *val)

{
  protobuf *this_00;
  char *size;
  string *in_RCX;
  StringPiece src;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
  this_00 = (protobuf *)(val->_M_dataplus)._M_p;
  size = (char *)val->_M_string_length;
  if ((long)size < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
  }
  src.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  src.ptr_ = size;
  CEscapeAndAppend(this_00,src,in_RCX);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintString(const string& val) const {
  string printed("\"");
  CEscapeAndAppend(val, &printed);
  printed.push_back('\"');
  return printed;
}